

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue-C-API.cpp
# Opt level: O2

void llb_build_value_get_stale_file_list
               (llb_build_value *value,void *context,_func_void_void_ptr_llb_data_t *iterator)

{
  llb_data_t lVar1;
  pointer pSVar2;
  llb_data_t data;
  StringRef string;
  vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> stringList;
  llb_data_t local_88;
  StringRef local_78;
  _Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_> local_68;
  string local_50;
  
  llbuild::buildsystem::BuildValue::getStaleFileList
            ((vector<llvm::StringRef,_std::allocator<llvm::StringRef>_> *)&local_68,
             (BuildValue *)value);
  for (pSVar2 = local_68._M_impl.super__Vector_impl_data._M_start;
      pSVar2 != local_68._M_impl.super__Vector_impl_data._M_finish; pSVar2 = pSVar2 + 1) {
    local_78.Data = pSVar2->Data;
    local_88.length = pSVar2->Length;
    local_78.Length = local_88.length;
    llvm::StringRef::str_abi_cxx11_(&local_50,&local_78);
    local_88.data = (uint8_t *)strdup(local_50._M_dataplus._M_p);
    std::__cxx11::string::_M_dispose();
    lVar1.data = local_88.data;
    lVar1.length = local_88.length;
    (*iterator)(context,lVar1);
    llb_data_destroy(&local_88);
  }
  std::_Vector_base<llvm::StringRef,_std::allocator<llvm::StringRef>_>::~_Vector_base(&local_68);
  return;
}

Assistant:

void llb_build_value_get_stale_file_list(llb_build_value *_Nonnull value, void *_Nullable context, void(*_Nonnull iterator)(void *_Nullable context, llb_data_t data)) {
  auto stringList = ((CAPIBuildValue *)value)->getInternalBuildValue().getStaleFileList();
  for (auto string: stringList) {
    llb_data_t data;
    data.length = string.size();
    data.data = (uint8_t *)strdup(string.str().c_str());
    iterator(context, data);
    llb_data_destroy(&data);
  }
}